

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

IterateResult __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::iterate(CaptureVertexInterleaved *this)

{
  ostringstream *this_00;
  RenderContext *pRVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  int iVar5;
  deUint32 err;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 *puVar7;
  char *description;
  TestContext *this_01;
  GLenum *pGVar8;
  GLint i_bind_case;
  uint uVar9;
  GLuint i_primitive_case;
  ulong uVar10;
  undefined1 local_1b0 [384];
  
  iVar4 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  ctxType.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x103);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_EXT_transform_feedback");
  if (bVar3) {
    pRVar1 = this->m_context->m_renderCtx;
    iVar5 = (*pRVar1->_vptr_RenderContext[7])(pRVar1,"glBindBufferOffsetEXT");
    this->m_glBindBufferOffsetEXT = (BindBufferOffsetEXT_ProcAddress)CONCAT44(extraout_var_00,iVar5)
    ;
    if ((BindBufferOffsetEXT_ProcAddress)CONCAT44(extraout_var_00,iVar5) ==
        (BindBufferOffsetEXT_ProcAddress)0x0) {
      puVar7 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar7 = 0;
      __cxa_throw(puVar7,&int::typeinfo,0);
    }
  }
  else if (!bVar2) {
    uVar6 = 1;
    goto LAB_00936403;
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  createFramebuffer(this);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
  createVertexArrayObject(this);
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x1680))(this->m_program);
  err = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  glu::checkError(err,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x94c);
  uVar9 = 0;
  uVar6 = 1;
  while ((uVar9 < 3 && ((uVar6 & 1) != 0))) {
    if ((uVar9 != 2) || (this->m_glBindBufferOffsetEXT != (BindBufferOffsetEXT_ProcAddress)0x0)) {
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])(this,(ulong)uVar9)
      ;
      pGVar8 = s_primitive_cases;
      uVar10 = 0;
      while ((uVar10 < 7 && ((uVar6 & 1) != 0))) {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
                  (this,uVar10 & 0xffffffff);
        uVar6 = *pGVar8;
        iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])
                          (this,(ulong)uVar6);
        if ((char)iVar4 == '\0') {
          uVar6 = 0;
        }
        else {
          uVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                            (this,(ulong)uVar9,(ulong)uVar6);
        }
        uVar10 = uVar10 + 1;
        pGVar8 = pGVar8 + 1;
      }
    }
    uVar9 = uVar9 + 1;
  }
LAB_00936403:
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xc])(this);
  bVar2 = (uVar6 & 1) == 0;
  if (bVar2) {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Fail";
  }
  else {
    local_1b0._0_8_ = this->m_context->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Capture Vertex have passed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
  }
  tcu::TestContext::setTestResult(this_01,(uint)bVar2,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::CaptureVertexInterleaved::iterate(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initializations. */
	bool is_at_least_gl_30 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 0)));
	bool is_ext_tf_1	   = m_context.getContextInfo().isExtensionSupported("GL_EXT_transform_feedback");

	bool is_ok		= true;
	bool test_error = false;

	try
	{
		if (is_ext_tf_1)
		{
			/* Extension query. */
			m_glBindBufferOffsetEXT =
				(BindBufferOffsetEXT_ProcAddress)m_context.getRenderContext().getProcAddress("glBindBufferOffsetEXT");

			if (DE_NULL == m_glBindBufferOffsetEXT)
			{
				throw 0;
			}
		}

		if (is_at_least_gl_30 || is_ext_tf_1)
		{
			fetchLimits();
			buildProgram();
			createFramebuffer();
			createTransformFeedbackBuffer();
			createVertexArrayObject();

			gl.useProgram(m_program);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

			for (glw::GLint i_bind_case = 0; (i_bind_case < BIND_BUFFER_CASES_COUNT) && is_ok; ++i_bind_case)
			{
				if ((i_bind_case == BIND_BUFFER_OFFSET_CASE) && (DE_NULL == m_glBindBufferOffsetEXT))
				{
					continue;
				}

				bindBuffer((BindBufferCase)i_bind_case);

				for (glw::GLuint i_primitive_case = 0; (i_primitive_case < s_primitive_cases_count) && is_ok;
					 ++i_primitive_case)
				{
					draw(i_primitive_case);

					is_ok = is_ok && checkFramebuffer(s_primitive_cases[i_primitive_case]);
					is_ok = is_ok && checkTransformFeedbackBuffer((BindBufferCase)i_bind_case,
																  s_primitive_cases[i_primitive_case]);
				}
			}
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Clean objects. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Capture Vertex have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}